

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cxx
# Opt level: O3

char * unique_id(void *o,char *type,char *name,char *label)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  id *piVar4;
  byte *pbVar5;
  uint uVar6;
  char *pcVar7;
  id **ppiVar8;
  char *pcVar9;
  byte *__s;
  char buffer [128];
  char local_b8 [136];
  
  cVar1 = *type;
  if (cVar1 == '\0') {
    pcVar9 = local_b8;
  }
  else {
    pcVar7 = type + 1;
    pcVar9 = local_b8;
    do {
      *pcVar9 = cVar1;
      pcVar9 = pcVar9 + 1;
      cVar1 = *pcVar7;
      pcVar7 = pcVar7 + 1;
    } while (cVar1 != '\0');
  }
  *pcVar9 = '_';
  __s = (byte *)(pcVar9 + 1);
  if (((name != (char *)0x0) && (bVar2 = *name, bVar2 != 0)) ||
     ((label != (char *)0x0 && (bVar2 = *label, name = label, bVar2 != 0)))) {
    do {
      if (((bVar2 == 0x5f) || (0xf5 < (byte)(bVar2 - 0x3a))) ||
         (0xe5 < (byte)((bVar2 & 0xdf) + 0xa5))) goto LAB_00193405;
      bVar2 = name[1];
      name = name + 1;
    } while (bVar2 != 0);
    bVar2 = 0;
LAB_00193405:
    if (((bVar2 == 0x5f) || (0xf5 < (byte)(bVar2 - 0x3a))) || (0xe5 < (byte)((bVar2 & 0xdf) + 0xa5))
       ) {
      pbVar5 = (byte *)(name + 1);
      do {
        do {
          *__s = bVar2;
          __s = __s + 1;
          bVar2 = *pbVar5;
          pbVar5 = pbVar5 + 1;
        } while (bVar2 == 0x5f);
      } while ((0xf5 < (byte)(bVar2 - 0x3a)) || (0xe5 < (byte)((bVar2 & 0xdf) + 0xa5)));
    }
  }
  *__s = 0;
  if (id_root == (id *)0x0) {
    ppiVar8 = &id_root;
  }
  else {
    uVar6 = 0;
    piVar4 = id_root;
    do {
      pcVar9 = piVar4->text;
      uVar3 = strcmp(local_b8,pcVar9);
      if (uVar3 == 0) {
        if (piVar4->object == o) {
          return pcVar9;
        }
        uVar6 = uVar6 + 1;
        sprintf((char *)__s,"%x",(ulong)uVar6);
        ppiVar8 = &id_root;
      }
      else {
        ppiVar8 = &piVar4->left + (~uVar3 >> 0x1f);
      }
      piVar4 = *ppiVar8;
    } while (piVar4 != (id *)0x0);
  }
  piVar4 = (id *)operator_new(0x20);
  pcVar9 = strdup(local_b8);
  piVar4->text = pcVar9;
  piVar4->object = o;
  piVar4->left = (id *)0x0;
  piVar4->right = (id *)0x0;
  *ppiVar8 = piVar4;
  return piVar4->text;
}

Assistant:

const char* unique_id(void* o, const char* type, const char* name, const char* label) {
  char buffer[128];
  char* q = buffer;
  while (*type) *q++ = *type++;
  *q++ = '_';
  const char* n = name;
  if (!n || !*n) n = label;
  if (n && *n) {
    while (*n && !is_id(*n)) n++;
    while (is_id(*n)) *q++ = *n++;
  }
  *q = 0;
  // okay, search the tree and see if the name was already used:
  id** p = &id_root;
  int which = 0;
  while (*p) {
    int i = strcmp(buffer, (*p)->text);
    if (!i) {
      if ((*p)->object == o) return (*p)->text;
      // already used, we need to pick a new name:
      sprintf(q,"%x",++which);
      p = &id_root;
      continue;
    }
    else if (i < 0) p = &((*p)->left);
    else p  = &((*p)->right);
  }
  *p = new id(buffer, o);
  return (*p)->text;
}